

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-default-loop-close.c
# Opt level: O2

int run_test_default_loop_close(void)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uStack_b0;
  uv_timer_t timer_handle;
  
  lVar2 = uv_default_loop();
  if (lVar2 == 0) {
    pcVar4 = "loop != NULL";
    uStack_b0 = 0x28;
  }
  else {
    iVar1 = uv_timer_init(lVar2,&timer_handle);
    if (iVar1 == 0) {
      iVar1 = uv_timer_start(&timer_handle,timer_cb,1,0);
      if (iVar1 == 0) {
        iVar1 = uv_run(lVar2,0);
        if (iVar1 == 0) {
          if (timer_cb_called == 1) {
            iVar1 = uv_loop_close(lVar2);
            if (iVar1 == 0) {
              lVar2 = uv_default_loop();
              if (lVar2 == 0) {
                pcVar4 = "loop != NULL";
                uStack_b0 = 0x31;
              }
              else {
                iVar1 = uv_timer_init(lVar2,&timer_handle);
                if (iVar1 == 0) {
                  iVar1 = uv_timer_start(&timer_handle,timer_cb,1,0);
                  if (iVar1 == 0) {
                    iVar1 = uv_run(lVar2,0);
                    if (iVar1 == 0) {
                      if (timer_cb_called == 2) {
                        iVar1 = uv_loop_close(lVar2);
                        if (iVar1 == 0) {
                          uVar3 = uv_default_loop();
                          uv_walk(uVar3,close_walk_cb,0);
                          uv_run(uVar3,0);
                          uVar3 = uv_default_loop();
                          iVar1 = uv_loop_close(uVar3);
                          if (iVar1 == 0) {
                            return 0;
                          }
                          pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                          uStack_b0 = 0x39;
                        }
                        else {
                          pcVar4 = "0 == uv_loop_close(loop)";
                          uStack_b0 = 0x37;
                        }
                      }
                      else {
                        pcVar4 = "2 == timer_cb_called";
                        uStack_b0 = 0x36;
                      }
                    }
                    else {
                      pcVar4 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
                      uStack_b0 = 0x35;
                    }
                  }
                  else {
                    pcVar4 = "0 == uv_timer_start(&timer_handle, timer_cb, 1, 0)";
                    uStack_b0 = 0x34;
                  }
                }
                else {
                  pcVar4 = "0 == uv_timer_init(loop, &timer_handle)";
                  uStack_b0 = 0x33;
                }
              }
            }
            else {
              pcVar4 = "0 == uv_loop_close(loop)";
              uStack_b0 = 0x2e;
            }
          }
          else {
            pcVar4 = "1 == timer_cb_called";
            uStack_b0 = 0x2d;
          }
        }
        else {
          pcVar4 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
          uStack_b0 = 0x2c;
        }
      }
      else {
        pcVar4 = "0 == uv_timer_start(&timer_handle, timer_cb, 1, 0)";
        uStack_b0 = 0x2b;
      }
    }
    else {
      pcVar4 = "0 == uv_timer_init(loop, &timer_handle)";
      uStack_b0 = 0x2a;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-default-loop-close.c"
          ,uStack_b0,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(default_loop_close) {
  uv_loop_t* loop;
  uv_timer_t timer_handle;

  loop = uv_default_loop();
  ASSERT(loop != NULL);

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);
  ASSERT(0 == uv_loop_close(loop));

  loop = uv_default_loop();
  ASSERT(loop != NULL);

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(2 == timer_cb_called);
  ASSERT(0 == uv_loop_close(loop));

  MAKE_VALGRIND_HAPPY();
  return 0;
}